

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::DataSegmentModuleField::~DataSegmentModuleField(DataSegmentModuleField *this)

{
  DataSegmentModuleField *this_local;
  
  (this->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField._vptr_ModuleField =
       (_func_int **)&PTR__DataSegmentModuleField_003902d0;
  DataSegment::~DataSegment(&this->data_segment);
  ModuleFieldMixin<(wabt::ModuleFieldType)8>::~ModuleFieldMixin
            (&this->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>);
  return;
}

Assistant:

explicit DataSegmentModuleField(const Location& loc = Location(),
                                  string_view name = string_view())
      : ModuleFieldMixin<ModuleFieldType::DataSegment>(loc),
        data_segment(name) {}